

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall
Jupiter::IRC::Client::Channel::Channel(Channel *this,string_view in_name,Client *in_parent)

{
  int iVar1;
  Config *pCVar2;
  anon_class_8_1_898f2789 local_68;
  anon_class_8_1_898f2789 read_type;
  string name;
  basic_string_view<char,_std::char_traits<char>_> *local_30;
  anon_class_8_1_f6ebc845 to_lower;
  Client *in_parent_local;
  Channel *this_local;
  string_view in_name_local;
  
  in_name_local._M_len = (size_t)in_name._M_str;
  this_local = (Channel *)in_name._M_len;
  to_lower.in_name = (string_view *)in_parent;
  std::__cxx11::string::string((string *)this);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
  ::unordered_map(&this->m_users);
  local_30 = (basic_string_view<char,_std::char_traits<char>_> *)&this_local;
  std::__cxx11::string::operator=((string *)this,local_30);
  this->m_parent = (Client *)to_lower.in_name;
  iVar1 = getDefaultChanType(this->m_parent);
  this->m_type = iVar1;
  Channel(std::basic_string_view<char,std::char_traits<char>>,Jupiter::IRC::Client*)::$_0::
  operator()[abi_cxx11_((string *)&read_type,&local_30);
  local_68.name = (string *)&read_type;
  pCVar2 = getSecondaryConfigSection(this->m_parent);
  if (pCVar2 != (Config *)0x0) {
    pCVar2 = getSecondaryConfigSection(this->m_parent);
    iVar1 = Channel::anon_class_8_1_898f2789::operator()(&local_68,pCVar2,this->m_type);
    this->m_type = iVar1;
  }
  pCVar2 = getPrimaryConfigSection(this->m_parent);
  if (pCVar2 != (Config *)0x0) {
    pCVar2 = getPrimaryConfigSection(this->m_parent);
    iVar1 = Channel::anon_class_8_1_898f2789::operator()(&local_68,pCVar2,this->m_type);
    this->m_type = iVar1;
  }
  std::__cxx11::string::~string((string *)&read_type);
  return;
}

Assistant:

Jupiter::IRC::Client::Channel::Channel(std::string_view in_name, Jupiter::IRC::Client *in_parent) {
	// TODO: remove this
	auto to_lower = [&in_name]() {
		std::string result;
		const char *itr = in_name.data();
		const char *end = itr + in_name.size();

		while (itr != end)
		{
			result += static_cast<char>(tolower(*itr));
			++itr;
		}

		return result;
	};

	m_name = in_name;
	m_parent = in_parent;
	m_type = m_parent->getDefaultChanType();

	std::string name = to_lower();

	auto read_type = [&name](Jupiter::Config &in_config, int default_type) {
		return in_config["Channels"sv][name].get<int>("Type"sv, default_type);
	};

	if (m_parent->getSecondaryConfigSection() != nullptr)
		m_type = read_type(*m_parent->getSecondaryConfigSection(), m_type);

	if (m_parent->getPrimaryConfigSection() != nullptr)
		m_type = read_type(*m_parent->getPrimaryConfigSection(), m_type);
}